

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

bool TestConstExpr::NotEqualTest<short,int>(void)

{
  bool bVar1;
  uint7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  bool bVar2;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd4;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffd6;
  int local_20;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_1c;
  undefined4 local_18;
  undefined4 local_10;
  undefined4 local_8;
  
  local_8 = 3;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<int>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)CONCAT26(in_stack_ffffffffffffffd6.m_int,
                           CONCAT24(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0.m_int)),
               (int *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  bVar1 = ::operator!=(in_stack_ffffffffffffffd0.m_int,in_stack_ffffffffffffffd6);
  bVar2 = false;
  if (bVar1) {
    local_10 = 4;
    SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt<int>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  *)CONCAT26(in_stack_ffffffffffffffd6.m_int,
                             CONCAT24(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0.m_int)),
                 (int *)(ulong)in_stack_ffffffffffffffc8);
    bVar1 = ::operator!=(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0.m_int);
    bVar2 = false;
    if (bVar1) {
      local_18 = 6;
      SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
      SafeInt<int>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    *)CONCAT26(in_stack_ffffffffffffffd6.m_int,
                               CONCAT24(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0.m_int)),
                   (int *)(ulong)in_stack_ffffffffffffffc8);
      local_20 = 7;
      SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
                (&local_1c,&local_20);
      bVar1 = ::operator!=(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0);
      bVar2 = false;
      if (bVar1) {
        SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
        SafeInt<int>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT26(in_stack_ffffffffffffffd6.m_int,
                                 CONCAT24(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0.m_int)
                                ),(int *)(ulong)in_stack_ffffffffffffffc8);
        bVar1 = ::operator!=(false,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                                    )0x0);
        bVar2 = false;
        if (bVar1) {
          SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
          SafeInt<int>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)((ulong)CONCAT22(in_stack_ffffffffffffffd6.m_int,in_stack_ffffffffffffffd4
                                          ) << 0x20),(int *)(ulong)in_stack_ffffffffffffffc8);
          bVar2 = ::operator!=(false,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                                      )0x0);
        }
      }
    }
  }
  return bVar2;
}

Assistant:

SAFEINT_CONSTEXPR11 bool NotEqualTest()
	{
		return
			(U)2 != SafeInt<T>(3) &&
			SafeInt<T>(4) != (U)5 &&
			SafeInt<T>(6) != SafeInt<U>(7) &&
			true != SafeInt<T>(1) &&
			false != SafeInt<T>(0);
	}